

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O2

ZipEntry __thiscall
Zippy::ZipArchive::AddEntryImpl(ZipArchive *this,string *name,ZipEntryData *data)

{
  size_type sVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  this_00;
  reference pvVar3;
  ZipLogicError *this_01;
  ZipEntryData *in_RCX;
  ZipEntry *extraout_RDX;
  long lVar4;
  ZipEntry ZVar5;
  allocator<char> local_529;
  ZipEntryData *local_528;
  string *local_520;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> folder;
  string local_4d0;
  ZipEntry local_4b0;
  
  if (name[4].field_2._M_local_buf[8] != '\0') {
    lVar4 = 0;
    local_528 = in_RCX;
    GetEntryNames_abi_cxx11_(&folders,(ZipArchive *)name,true,false);
    local_520 = name + 5;
    while( true ) {
      sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)data,
                         '/',(long)(int)lVar4);
      if (sVar1 == 0xffffffffffffffff) break;
      sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)data,
                         '/',(long)(int)lVar4);
      lVar4 = sVar1 + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&folder,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)data,0
                 ,(long)(int)lVar4);
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (folders.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         folders.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&folder);
      if (_Var2._M_current ==
          folders.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"",&local_529);
        Impl::ZipEntry::ZipEntry(&local_4b0,&folder,&local_4d0);
        std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::
        emplace_back<Zippy::Impl::ZipEntry>
                  ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
                   local_520,&local_4b0);
        Impl::ZipEntry::~ZipEntry(&local_4b0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&folders,
                   &folder);
      }
      std::__cxx11::string::~string((string *)&folder);
    }
    this_00 = std::
              __find_if<__gnu_cxx::__normal_iterator<Zippy::Impl::ZipEntry*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>,__gnu_cxx::__ops::_Iter_pred<Zippy::ZipArchive::AddEntryImpl(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(Zippy::Impl::ZipEntry_const&)_1_>>
                        (name[5]._M_dataplus._M_p,name[5]._M_string_length,data);
    if (this_00._M_current == (ZipEntry *)name[5]._M_string_length) {
      Impl::ZipEntry::ZipEntry(&local_4b0,(string *)data,local_528);
      pvVar3 = std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::
               emplace_back<Zippy::Impl::ZipEntry>
                         ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
                          local_520,&local_4b0);
      this->_vptr_ZipArchive = (_func_int **)&PTR__ZipEntry_00184b40;
      (this->m_Archive).m_archive_size = (mz_uint64)pvVar3;
      Impl::ZipEntry::~ZipEntry(&local_4b0);
    }
    else {
      Impl::ZipEntry::SetData(this_00._M_current,local_528);
      this->_vptr_ZipArchive = (_func_int **)&PTR__ZipEntry_00184b40;
      (this->m_Archive).m_archive_size = (mz_uint64)this_00._M_current;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&folders);
    ZVar5.m_ZipEntry = extraout_RDX;
    ZVar5._vptr_ZipEntry = (_func_int **)this;
    return ZVar5;
  }
  this_01 = (ZipLogicError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"Cannot call AddEntry on empty ZipArchive object!",
             (allocator<char> *)&folder);
  ZipLogicError::ZipLogicError(this_01,(string *)&local_4b0);
  __cxa_throw(this_01,&ZipLogicError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

ZipEntry AddEntryImpl(const std::string& name, const ZipEntryData& data) {

            if (!IsOpen()) throw ZipLogicError("Cannot call AddEntry on empty ZipArchive object!");

            // ===== Ensure that all folders and subfolders have an entry in the archive
            auto folders = GetEntryNames(true, false);
            auto pos = 0;
            while (name.find('/', pos) != std::string::npos) {
                pos = name.find('/', pos) + 1;
                auto folder = name.substr(0, pos);

                // ===== If folder isn't registered in the archive, add it.
                if (std::find(folders.begin(), folders.end(), folder) == folders.end()) {
                    m_ZipEntries.emplace_back(Impl::ZipEntry(folder, ""));
                    folders.emplace_back(folder);
                }
            }

            // ===== Check if an entry with the given name already exists in the archive.
            auto result = std::find_if(m_ZipEntries.begin(), m_ZipEntries.end(), [&](const Impl::ZipEntry& entry) {
                return name == entry.GetName();
            });

            // ===== If the entry exists, replace the existing data with the new data, and return the ZipEntry object.
            if (result != m_ZipEntries.end()) {
                result->SetData(data);
                return ZipEntry(&*result);
            }

            // ===== Finally, add a new entry with the given name and data, and return the object.
            return ZipEntry(&m_ZipEntries.emplace_back(Impl::ZipEntry(name, data)));
        }